

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceVariableAccessesWithConstantElements
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *var)

{
  IRContext *this_00;
  Instruction *access_chain;
  undefined8 *puVar1;
  Constant *pCVar2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  bool bVar3;
  undefined8 *puVar4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> work_list;
  undefined8 *local_78;
  undefined8 *puStack_70;
  long local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_78 = (undefined8 *)0x0;
  puStack_70 = (undefined8 *)0x0;
  local_68 = 0;
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:54:39)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:54:39)>
             ::_M_manager;
  local_58._M_unused._M_object = &local_78;
  analysis::DefUseManager::ForEachUser
            ((this_00->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             var,(function<void_(spvtools::opt::Instruction_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  puVar1 = puStack_70;
  bVar3 = false;
  for (puVar4 = local_78; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    access_chain = (Instruction *)*puVar4;
    pCVar2 = descsroautil::GetAccessChainIndexAsConst((this->super_Pass).context_,access_chain);
    if (pCVar2 == (Constant *)0x0) {
      ReplaceAccessChain(this,var,access_chain);
      bVar3 = true;
    }
  }
  if (local_78 != (undefined8 *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return bVar3;
}

Assistant:

bool ReplaceDescArrayAccessUsingVarIndex::
    ReplaceVariableAccessesWithConstantElements(Instruction* var) const {
  std::vector<Instruction*> work_list;
  get_def_use_mgr()->ForEachUser(var, [&work_list](Instruction* use) {
    switch (use->opcode()) {
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
        work_list.push_back(use);
        break;
      default:
        break;
    }
  });

  bool updated = false;
  for (Instruction* access_chain : work_list) {
    if (descsroautil::GetAccessChainIndexAsConst(context(), access_chain) ==
        nullptr) {
      ReplaceAccessChain(var, access_chain);
      updated = true;
    }
  }
  // Note that we do not consider OpLoad and OpCompositeExtract because
  // OpCompositeExtract always has constant literals for indices.
  return updated;
}